

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

CatalogEntryLookup *
duckdb::Catalog::TryLookupEntry
          (CatalogEntryLookup *__return_storage_ptr__,CatalogEntryRetriever *retriever,
          string *catalog,string *schema,EntryLookupInfo *lookup_info,OnEntryNotFound if_not_found)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6;
  pointer pCVar2;
  uint uVar3;
  Catalog *pCVar4;
  CatalogEntry *pCVar5;
  SchemaCatalogEntry *pSVar6;
  CatalogException *this;
  CatalogType type;
  CatalogLookup *lookup;
  pointer __args;
  vector<duckdb::CatalogLookup,std::allocator<duckdb::CatalogLookup>> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2;
  pointer catalog_name;
  undefined8 uVar7;
  undefined8 uStack_390;
  vector<duckdb::CatalogLookup,_true> final_lookups;
  undefined8 uStack_370;
  vector<duckdb::CatalogLookup,_true> lookups;
  vector<duckdb::CatalogSearchEntry,_true> entries;
  string local_320 [32];
  string fully_qualified_catalog_name_hint;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  string local_200 [32];
  string fully_qualified_name_hint;
  string entry_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  CatalogEntryLookup lookup_result;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  GetCatalogEntries(&entries,retriever,catalog,schema);
  lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
  super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
  super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
  super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  final_lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
  super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  final_lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
  super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  final_lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
  super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::reserve
            (&lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>,
             (long)entries.
                   super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                   .
                   super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)entries.
                   super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                   .
                   super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6);
  for (catalog_name = entries.
                      super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                      .
                      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      pCVar2 = final_lookups.
               super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
               super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
               _M_impl.super__Vector_impl_data._M_finish,
      catalog_name !=
      entries.super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish; catalog_name = catalog_name + 1) {
    lookup_result.schema.ptr = (SchemaCatalogEntry *)0x0;
    if (if_not_found == RETURN_NULL) {
      lookup_result.schema.ptr =
           (SchemaCatalogEntry *)GetCatalogEntry(retriever,&catalog_name->catalog);
      if ((Catalog *)lookup_result.schema.ptr == (Catalog *)0x0) {
        (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
        (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
        ErrorData::ErrorData(&__return_storage_ptr__->error);
        goto LAB_016098ce;
      }
    }
    else {
      lookup_result.schema.ptr = (SchemaCatalogEntry *)GetCatalog(retriever,&catalog_name->catalog);
    }
    pCVar4 = optional_ptr<duckdb::Catalog,_true>::operator->
                       ((optional_ptr<duckdb::Catalog,_true> *)&lookup_result);
    uVar3 = (*pCVar4->_vptr_Catalog[0x18])(pCVar4,(ulong)lookup_info->catalog_type);
    if ((char)uVar3 == '\x01') {
      pCVar4 = optional_ptr<duckdb::Catalog,_true>::operator*
                         ((optional_ptr<duckdb::Catalog,_true> *)&lookup_result);
      this_00 = (vector<duckdb::CatalogLookup,std::allocator<duckdb::CatalogLookup>> *)
                &final_lookups;
LAB_016095cd:
      ::std::vector<duckdb::CatalogLookup,std::allocator<duckdb::CatalogLookup>>::
      emplace_back<duckdb::Catalog&,std::__cxx11::string&,duckdb::EntryLookupInfo_const&>
                (this_00,pCVar4,&catalog_name->schema,lookup_info);
    }
    else if ((uVar3 & 0xff) == 0) {
      pCVar4 = optional_ptr<duckdb::Catalog,_true>::operator*
                         ((optional_ptr<duckdb::Catalog,_true> *)&lookup_result);
      this_00 = (vector<duckdb::CatalogLookup,std::allocator<duckdb::CatalogLookup>> *)&lookups;
      goto LAB_016095cd;
    }
  }
  for (__args = final_lookups.
                super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
                super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
                _M_impl.super__Vector_impl_data._M_start; __args != pCVar2; __args = __args + 1) {
    ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::
    emplace_back<duckdb::CatalogLookup>
              (&lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>,
               __args);
  }
  TryLookupEntry(&lookup_result,retriever,&lookups,lookup_info,if_not_found);
  if (lookup_info->catalog_type == TABLE_ENTRY) {
    params_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    TryLookupDefaultTable(__return_storage_ptr__,retriever,catalog,schema,lookup_info,RETURN_NULL);
    if ((__return_storage_ptr__->entry).ptr != (CatalogEntry *)0x0) {
      if (lookup_result.entry.ptr != (CatalogEntry *)0x0) {
        psVar1 = lookup_info->name;
        pCVar5 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&lookup_result.entry);
        CatalogTypeToString_abi_cxx11_(&entry_type,(duckdb *)(ulong)pCVar5->type,type);
        fully_qualified_name_hint._M_dataplus._M_p = (pointer)&fully_qualified_name_hint.field_2;
        fully_qualified_name_hint._M_string_length = 0;
        fully_qualified_name_hint.field_2._M_local_buf[0] = '\0';
        if (lookup_result.schema.ptr != (SchemaCatalogEntry *)0x0) {
          ::std::__cxx11::string::string(local_200,": \'%s.%s.%s\'",(allocator *)local_320);
          pSVar6 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->(&lookup_result.schema)
          ;
          ::std::__cxx11::string::string
                    ((string *)&local_220,
                     (string *)
                     &(((pSVar6->super_InCatalogEntry).catalog)->db->super_CatalogEntry).name);
          pSVar6 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->(&lookup_result.schema)
          ;
          ::std::__cxx11::string::string
                    ((string *)&local_240,
                     (string *)&(pSVar6->super_InCatalogEntry).super_CatalogEntry.name);
          pCVar5 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&lookup_result.entry);
          ::std::__cxx11::string::string((string *)&local_260,(string *)&pCVar5->name);
          StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (&fully_qualified_catalog_name_hint,(StringUtil *)local_200,&local_220,
                     &local_240,&local_260,params_2);
          ::std::__cxx11::string::operator=
                    ((string *)&fully_qualified_name_hint,
                     (string *)&fully_qualified_catalog_name_hint);
          ::std::__cxx11::string::~string((string *)&fully_qualified_catalog_name_hint);
          ::std::__cxx11::string::~string((string *)&local_260);
          ::std::__cxx11::string::~string((string *)&local_240);
          ::std::__cxx11::string::~string((string *)&local_220);
          ::std::__cxx11::string::~string(local_200);
        }
        ::std::__cxx11::string::string(local_320,": \'%s.%s.%s\'",(allocator *)&local_2e0);
        pSVar6 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->
                           (&__return_storage_ptr__->schema);
        ::std::__cxx11::string::string
                  ((string *)&local_280,
                   (string *)
                   &(((pSVar6->super_InCatalogEntry).catalog)->db->super_CatalogEntry).name);
        pSVar6 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->
                           (&__return_storage_ptr__->schema);
        ::std::__cxx11::string::string
                  ((string *)&local_2a0,
                   (string *)&(pSVar6->super_InCatalogEntry).super_CatalogEntry.name);
        pCVar5 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                           (&__return_storage_ptr__->entry);
        ::std::__cxx11::string::string((string *)&local_2c0,(string *)&pCVar5->name);
        StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&fully_qualified_catalog_name_hint,(StringUtil *)local_320,&local_280,&local_2a0,
                   &local_2c0,params_2);
        ::std::__cxx11::string::~string((string *)&local_2c0);
        ::std::__cxx11::string::~string((string *)&local_2a0);
        ::std::__cxx11::string::~string((string *)&local_280);
        ::std::__cxx11::string::~string(local_320);
        this = (CatalogException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_2e0,
                   "Ambiguity detected for \'%s\': this could either refer to the \'%s\' \'%s\', or the attached catalog \'%s\' which has a default table. To avoid this error, either detach the catalog and reattach under a different name, or use a fully qualified name for the \'%s\'%s or for the Catalog Default Table%s."
                   ,(allocator *)((long)&uStack_390 + 7));
        ::std::__cxx11::string::string((string *)&local_140,(string *)psVar1);
        ::std::__cxx11::string::string((string *)&local_160,(string *)&entry_type);
        ::std::__cxx11::string::string((string *)&local_180,(string *)psVar1);
        ::std::__cxx11::string::string((string *)&local_1a0,(string *)psVar1);
        ::std::__cxx11::string::string(local_50,(string *)&entry_type);
        ::std::__cxx11::string::string(local_70,(string *)&fully_qualified_name_hint);
        uVar7 = 0x160983a;
        ::std::__cxx11::string::string(local_90,(string *)&fully_qualified_catalog_name_hint);
        params_4._M_string_length = (size_type)local_70;
        params_4._M_dataplus._M_p = (pointer)local_50;
        params_4.field_2._M_allocated_capacity = (size_type)local_90;
        params_4.field_2._8_8_ = uVar7;
        params_5._M_string_length = uStack_390;
        params_5._M_dataplus._M_p = (pointer)__return_storage_ptr__;
        params_5.field_2._M_allocated_capacity =
             (size_type)
             final_lookups.
             super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             _M_impl.super__Vector_impl_data._M_start;
        params_5.field_2._8_8_ =
             final_lookups.
             super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        params_6._M_string_length = uStack_370;
        params_6._M_dataplus._M_p =
             (pointer)final_lookups.
                      super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
                      super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        params_6.field_2._M_allocated_capacity =
             (size_type)
             lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             _M_impl.super__Vector_impl_data._M_start;
        params_6.field_2._8_8_ =
             lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             super__Vector_base<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        CatalogException::
        CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (this,&local_2e0,&local_140,&local_160,&local_180,&local_1a0,params_4,params_5,
                   params_6);
        __cxa_throw(this,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_016098c1;
    }
    ErrorData::~ErrorData(&__return_storage_ptr__->error);
  }
  CatalogEntryLookup::CatalogEntryLookup(__return_storage_ptr__,&lookup_result);
LAB_016098c1:
  ErrorData::~ErrorData(&lookup_result.error);
LAB_016098ce:
  ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::~vector
            (&final_lookups.
              super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>);
  ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::~vector
            (&lookups.super_vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>);
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&entries.
              super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>)
  ;
  return __return_storage_ptr__;
}

Assistant:

CatalogEntryLookup Catalog::TryLookupEntry(CatalogEntryRetriever &retriever, const string &catalog,
                                           const string &schema, const EntryLookupInfo &lookup_info,
                                           OnEntryNotFound if_not_found) {
	auto entries = GetCatalogEntries(retriever, catalog, schema);
	vector<CatalogLookup> lookups;
	vector<CatalogLookup> final_lookups;
	lookups.reserve(entries.size());
	for (auto &entry : entries) {
		optional_ptr<Catalog> catalog_entry;
		if (if_not_found == OnEntryNotFound::RETURN_NULL) {
			catalog_entry = Catalog::GetCatalogEntry(retriever, entry.catalog);
		} else {
			catalog_entry = &Catalog::GetCatalog(retriever, entry.catalog);
		}
		if (!catalog_entry) {
			return {nullptr, nullptr, ErrorData()};
		}
		D_ASSERT(catalog_entry);
		auto lookup_behavior = catalog_entry->CatalogTypeLookupRule(lookup_info.GetCatalogType());
		if (lookup_behavior == CatalogLookupBehavior::STANDARD) {
			lookups.emplace_back(*catalog_entry, entry.schema, lookup_info);
		} else if (lookup_behavior == CatalogLookupBehavior::LOWER_PRIORITY) {
			final_lookups.emplace_back(*catalog_entry, entry.schema, lookup_info);
		}
	}

	for (auto &lookup : final_lookups) {
		lookups.emplace_back(std::move(lookup));
	}

	// Do the main lookup
	auto lookup_result = TryLookupEntry(retriever, lookups, lookup_info, if_not_found);

	// Special case for tables: we do a second lookup searching for catalogs with default tables that also match this
	// lookup
	if (lookup_info.GetCatalogType() == CatalogType::TABLE_ENTRY) {
		auto lookup_result_default_table =
		    TryLookupDefaultTable(retriever, catalog, schema, lookup_info, OnEntryNotFound::RETURN_NULL);

		if (lookup_result_default_table.Found() && lookup_result.Found()) {
			ThrowDefaultTableAmbiguityException(lookup_result, lookup_result_default_table, lookup_info.GetEntryName());
		}

		if (lookup_result_default_table.Found()) {
			return lookup_result_default_table;
		}
	}

	return lookup_result;
}